

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_643cf::MkdirTool::createCommand(MkdirTool *this,StringRef name)

{
  ExternalCommand *this_00;
  size_t in_RCX;
  StringRef SVar1;
  
  this_00 = (ExternalCommand *)operator_new(0x138);
  SVar1.Length = in_RCX;
  SVar1.Data = (char *)name.Length;
  llbuild::buildsystem::ExternalCommand::Command(this_00,SVar1);
  (this_00->super_Command).super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__ExternalCommand_001da3d8;
  (this->super_Tool)._vptr_Tool = (_func_int **)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    auto res = llvm::make_unique<MkdirCommand>(name);
    return res;
  }